

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>::TestBody
          (NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>
           *this)

{
  bool bVar1;
  char *pcVar2;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *this_00;
  ForeignEnum *pFVar3;
  Eq2Matcher *tuple2_matcher;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *pMVar4;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>
  *matcher;
  char *in_R9;
  AssertHelper local_3c0;
  Message local_3b8;
  key_arg<int> local_3b0;
  ForeignEnum local_3ac;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_2;
  Message local_390;
  testing local_381;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>
  local_380;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
  local_360;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_310;
  Message local_308;
  string local_300;
  string_view local_2e0;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__2;
  TestAllMapTypes rt_msg;
  AssertHelper local_1c0;
  Message local_1b8;
  string local_1b0;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  TypeParam *output_sink;
  AssertHelper local_120;
  Message local_118 [3];
  int local_100;
  undefined1 local_fc [4];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  TestAllMapTypes msg;
  NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>
  *this_local;
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
            ((TestAllMapTypes *)&gtest_ar.message_);
  local_fc = (undefined1  [4])0x0;
  local_100 = 0;
  pMVar4 = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)local_fc;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_f8,"static_cast<uint32_t>(FOREIGN_FOO)","0",(uint *)pMVar4,&local_100
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    pMVar4 = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)0x3aa;
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x3aa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(local_118);
  }
  output_sink._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  if (output_sink._4_4_ == 0) {
    this_00 = proto2_nofieldpresence_unittest::TestAllMapTypes::mutable_map_int32_foreign_enum
                        ((TestAllMapTypes *)&gtest_ar.message_);
    output_sink._0_4_ = 0;
    pFVar3 = Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::operator[]<int>
                       (this_00,(key_arg<int> *)&output_sink);
    *pFVar3 = FOREIGN_FOO;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>::GetOutputSinkRef
                     (&this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>);
    local_141 = TestSerialize<absl::lts_20250127::Cord>
                          ((MessageLite *)&gtest_ar.message_,
                           (Cord *)gtest_ar_.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_140,&local_141,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_140,
                 (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pMVar4 = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)0x3af;
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x3af,pcVar2);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_150);
    }
    output_sink._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    if (output_sink._4_4_ == 0) {
      protobuf::(anonymous_namespace)::NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>::
      GetOutput_abi_cxx11_(&local_1b0,this);
      local_189 = (bool)std::__cxx11::string::empty();
      local_189 = (bool)(local_189 ^ 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_188,&local_189,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_1b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar1) {
        testing::Message::Message(&local_1b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&rt_msg.field_0._impl_._cached_size_,(internal *)local_188,
                   (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        pMVar4 = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)0x3b1;
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3b1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        std::__cxx11::string::~string((string *)&rt_msg.field_0._impl_._cached_size_);
        testing::Message::~Message(&local_1b8);
      }
      output_sink._4_4_ = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      if (output_sink._4_4_ == 0) {
        proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
                  ((TestAllMapTypes *)&gtest_ar__2.message_);
        protobuf::(anonymous_namespace)::NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>::
        GetOutput_abi_cxx11_(&local_300,this);
        local_2e0 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_300);
        local_2c9 = protobuf::MessageLite::ParseFromString
                              ((MessageLite *)&gtest_ar__2.message_,local_2e0);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_300);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
        if (!bVar1) {
          testing::Message::Message(&local_308);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1.message_,(internal *)local_2c8,
                     (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false","true",
                     in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          pMVar4 = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)0x3b5;
          testing::internal::AssertHelper::AssertHelper
                    (&local_310,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x3b5,pcVar2);
          testing::internal::AssertHelper::operator=(&local_310,&local_308);
          testing::internal::AssertHelper::~AssertHelper(&local_310);
          std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_308);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
        testing::Eq();
        tuple2_matcher =
             (Eq2Matcher *)
             proto2_nofieldpresence_unittest::TestAllMapTypes::map_int32_foreign_enum
                       ((TestAllMapTypes *)&gtest_ar.message_);
        testing::
        UnorderedPointwise<testing::internal::Eq2Matcher,google::protobuf::Map<int,proto2_nofieldpresence_unittest::ForeignEnum>>
                  (&local_380,&local_381,tuple2_matcher,pMVar4);
        testing::internal::
        MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,std::pair<int_const,proto2_nofieldpresence_unittest::ForeignEnum>>>>
                  (&local_360,(internal *)&local_380,matcher);
        proto2_nofieldpresence_unittest::TestAllMapTypes::map_int32_foreign_enum
                  ((TestAllMapTypes *)&gtest_ar__2.message_);
        testing::internal::
        PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,std::pair<int_const,proto2_nofieldpresence_unittest::ForeignEnum>>>>
        ::operator()(local_340,(char *)&local_360,
                     (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)
                     "rt_msg.map_int32_foreign_enum()");
        testing::internal::
        PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
        ::~PredicateFormatterFromMatcher(&local_360);
        testing::internal::
        UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>
        ::~UnorderedElementsAreArrayMatcher(&local_380);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
        if (!bVar1) {
          testing::Message::Message(&local_390);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x3b7,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_390);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_390);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
        local_3ac = FOREIGN_FOO;
        pMVar4 = proto2_nofieldpresence_unittest::TestAllMapTypes::map_int32_foreign_enum
                           ((TestAllMapTypes *)&gtest_ar__2.message_);
        local_3b0 = 0;
        pFVar3 = Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::at<int>(pMVar4,&local_3b0);
        testing::internal::EqHelper::
        Compare<proto2_nofieldpresence_unittest::ForeignEnum,_proto2_nofieldpresence_unittest::ForeignEnum,_nullptr>
                  ((EqHelper *)local_3a8,"FOREIGN_FOO","rt_msg.map_int32_foreign_enum().at(0)",
                   &local_3ac,pFVar3);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
        if (!bVar1) {
          testing::Message::Message(&local_3b8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_3c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x3bb,pcVar2);
          testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
          testing::internal::AssertHelper::~AssertHelper(&local_3c0);
          testing::Message::~Message(&local_3b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
        proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes
                  ((TestAllMapTypes *)&gtest_ar__2.message_);
        output_sink._4_4_ = 0;
      }
    }
  }
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes
            ((TestAllMapTypes *)&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripZeroKeyZeroEnum) {
  TestAllMapTypes msg;
  ASSERT_EQ(static_cast<uint32_t>(FOREIGN_FOO), 0);
  (*msg.mutable_map_int32_foreign_enum())[0] = FOREIGN_FOO;

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_foreign_enum(),
              UnorderedPointwise(Eq(), msg.map_int32_foreign_enum()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(FOREIGN_FOO, rt_msg.map_int32_foreign_enum().at(0));
}